

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

void __thiscall ON_BrepFace::ON_BrepFace(ON_BrepFace *this,int face_index)

{
  Impl *pIVar1;
  
  ON_SurfaceProxy::ON_SurfaceProxy(&this->super_ON_SurfaceProxy,(ON_Surface *)0x0);
  (this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_0081ebf0;
  this->m_status = ON_ComponentStatus::NoneSet;
  this->m_pack_id_low = 0;
  this->m_face_index = face_index;
  (this->m_li)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081add8;
  (this->m_li).m_a = (int *)0x0;
  (this->m_li).m_count = 0;
  (this->m_li).m_capacity = 0;
  this->m_si = -1;
  this->m_bRev = false;
  this->m_reserved2 = '\0';
  this->m_pack_id_high = 0;
  this->m_face_material_channel = 0;
  (this->m_face_uuid).Data1 = 0;
  (this->m_face_uuid).Data2 = 0;
  (this->m_face_uuid).Data3 = 0;
  (this->m_face_uuid).Data4[0] = '\0';
  (this->m_face_uuid).Data4[1] = '\0';
  (this->m_face_uuid).Data4[2] = '\0';
  (this->m_face_uuid).Data4[3] = '\0';
  (this->m_face_uuid).Data4[4] = '\0';
  (this->m_face_uuid).Data4[5] = '\0';
  (this->m_face_uuid).Data4[6] = '\0';
  (this->m_face_uuid).Data4[7] = '\0';
  (this->m_per_face_color).field_0 = ON_Color::UnsetColor.field_0;
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  ON_Interval::ON_Interval((ON_Interval *)&this->field_0x98);
  ON_Interval::ON_Interval((ON_Interval *)&this->field_0xa8);
  pIVar1 = (Impl *)operator_new(0x58);
  *(undefined8 *)((long)&(pIVar1->m_mesh_mutex).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (pIVar1->m_mesh_mutex).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pIVar1->m_mesh_mutex).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pIVar1->m_mesh_mutex).super___recursive_mutex_base._M_mutex + 8) = 0;
  (pIVar1->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pIVar1->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pIVar1->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pIVar1->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pIVar1->m_mesh_mutex).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (pIVar1->m_mesh_mutex).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  this->m_pImpl = pIVar1;
  (this->m_face_user).h = 0;
  this->m_reserved0 = (void *)0x0;
  this->m_reserved1 = (void *)0x0;
  this->m_brep = (ON_Brep *)0x0;
  return;
}

Assistant:

ON_BrepFace::ON_BrepFace(int face_index) 
  : ON_SurfaceProxy(0),
  m_face_index(face_index),
  m_pImpl(new Impl)
{
  memset(&m_face_user,0,sizeof(m_face_user));
}